

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdconntable.c
# Opt level: O0

int HashInStdResTbl(char *s)

{
  uint uVar1;
  uint local_14;
  uint g;
  uint h;
  char *s_local;
  
  local_14 = 0;
  for (_g = s; *_g != '\0'; _g = _g + 1) {
    local_14 = local_14 * 0x10 + (int)*_g;
    uVar1 = local_14 & 0xf0000000;
    if (uVar1 != 0) {
      local_14 = uVar1 ^ uVar1 >> 0x18 ^ local_14;
    }
  }
  return local_14 % 0xa39;
}

Assistant:

int HashInStdResTbl(char *s) {
   unsigned h, g;

   for (h = 0; *s != '\0'; s++) {
      h = (h<<4) + *s;
      if ( (g = h & 0xf0000000) ) {
	 h ^= g >> 24;
	 h ^= g;
      }
   }
   return h % M;
}